

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# autotune.cc
# Opt level: O3

int __thiscall
fasttext::AutotuneStrategy::getIndex
          (AutotuneStrategy *this,int val,vector<int,_std::allocator<int>_> *choices)

{
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> _Var1;
  int iVar2;
  
  _Var1 = std::
          __find_if<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_equals_val<int_const>>
                    ((choices->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                     super__Vector_impl_data._M_start,
                     (choices->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                     super__Vector_impl_data._M_finish);
  iVar2 = (int)((ulong)((long)_Var1._M_current -
                       (long)(choices->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                             super__Vector_impl_data._M_start) >> 2);
  if (_Var1._M_current ==
      (choices->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
      _M_finish) {
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

int AutotuneStrategy::getIndex(int val, const std::vector<int>& choices) {
  auto found = std::find(choices.begin(), choices.end(), val);
  int ind = 0;
  if (found != choices.end()) {
    ind = std::distance(choices.begin(), found);
  }
  return ind;
}